

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O2

void test_skiplist_query_exist_populated_single(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  int local_84;
  int key;
  ion_byte_t value [10];
  ion_byte_t test_value [10];
  ion_skiplist_t skiplist;
  
  initialize_skiplist_std_conditions(&skiplist);
  for (local_84 = 0; local_84 < 100; local_84 = local_84 + 2) {
    sprintf((char *)test_value,"Find %d");
    iVar2 = sl_insert(&skiplist,&local_84,test_value);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.error == '\0'),0x2f6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_00102836;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar2 & 0xffffffff00000000) == 0x100000000),0x2f7,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_00102836;
  }
  key = 0x18;
  iVar2 = sl_get(&skiplist,&key,value);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2.error == '\0'),0x303,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar2 & 0xffffffff00000000) == 0x100000000),0x304,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      pVar1 = planck_unit_assert_str_are_equal
                        (tc,(char *)value,"Find 24",0x305,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                        );
      if (pVar1 != '\0') {
        sl_destroy(&skiplist);
        return;
      }
    }
  }
LAB_00102836:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_query_exist_populated_single(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t test_value[10];

	int i;

	for (i = 0; i < 100; i += 2) {
		sprintf((char *) test_value, "Find %d", i);

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, test_value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	int			key		= 24;
	ion_byte_t	value[10];

	ion_status_t status = sl_get(&skiplist, (ion_key_t) &key, value);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, "Find 24");

	sl_destroy(&skiplist);
}